

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

void __thiscall
Lib::Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash>::Map
          (Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash> *this,
          Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash> *other)

{
  Entry *pEVar1;
  int iVar2;
  
  iVar2 = other->_noOfEntries;
  this->_capacity = other->_capacity;
  this->_noOfEntries = iVar2;
  pEVar1 = other->_afterLast;
  this->_entries = other->_entries;
  this->_afterLast = pEVar1;
  this->_maxEntries = other->_maxEntries;
  *(undefined8 *)((long)&other->_entries + 4) = 0;
  *(undefined8 *)((long)&other->_afterLast + 4) = 0;
  other->_capacity = 0;
  other->_noOfEntries = 0;
  other->_entries = (Entry *)0x0;
  return;
}

Assistant:

Map (Map && other)
    : _capacity   (other._capacity),
      _noOfEntries(other._noOfEntries),
      _entries    (other._entries),
      _afterLast  (other._afterLast),
      _maxEntries (other._maxEntries)
  {
    other._capacity    = 0;
    other._noOfEntries = 0;
    other._entries     = nullptr;
    other._afterLast   = nullptr;
    other._maxEntries  = 0;
  }